

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_data_allocator.cpp
# Opt level: O2

void __thiscall
duckdb::ColumnDataAllocator::InitializeChunkState
          (ColumnDataAllocator *this,ChunkManagementState *state,ChunkMetaData *chunk)

{
  __node_base *p_Var1;
  uint uVar2;
  iterator iVar3;
  iterator iVar4;
  mapped_type *this_00;
  __node_base *p_Var5;
  _Node_iterator_base<std::pair<const_unsigned_long,_duckdb::BufferHandle>,_false> __it;
  ulong local_50;
  BufferHandle local_48;
  
  if ((this->type & ~HYBRID) == BUFFER_MANAGER_ALLOCATOR) {
    p_Var1 = &(state->handles)._M_h._M_before_begin;
    __it._M_cur = (__node_type *)p_Var1;
    while (__it._M_cur = (__node_type *)((__it._M_cur)->super__Hash_node_base)._M_nxt,
          __it._M_cur != (__node_type *)0x0) {
      uVar2 = NumericCastImpl<unsigned_int,_unsigned_long,_false>::Convert
                        (*(unsigned_long *)((long)__it._M_cur + 8));
      local_48.handle.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)
               CONCAT44(local_48.handle.internal.
                        super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr.
                        _4_4_,uVar2);
      iVar3 = ::std::
              _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::find(&(chunk->block_ids)._M_h,(key_type_conflict2 *)&local_48);
      if (iVar3.super__Node_iterator_base<unsigned_int,_false>._M_cur == (__node_type *)0x0) {
        ::std::
        _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::BufferHandle>,_std::allocator<std::pair<const_unsigned_long,_duckdb::BufferHandle>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::erase((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::BufferHandle>,_std::allocator<std::pair<const_unsigned_long,_duckdb::BufferHandle>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)state,(const_iterator)__it._M_cur);
        __it._M_cur = (__node_type *)p_Var1;
      }
    }
    p_Var5 = &(chunk->block_ids)._M_h._M_before_begin;
    while (p_Var5 = p_Var5->_M_nxt, p_Var5 != (__node_base *)0x0) {
      local_48.handle.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)(ulong)(uint)*(size_type *)(p_Var5 + 1);
      iVar4 = ::std::
              _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::BufferHandle>,_std::allocator<std::pair<const_unsigned_long,_duckdb::BufferHandle>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::BufferHandle>,_std::allocator<std::pair<const_unsigned_long,_duckdb::BufferHandle>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                      *)state,(key_type *)&local_48);
      if (iVar4.
          super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::BufferHandle>,_false>.
          _M_cur == (__node_type *)0x0) {
        Pin(&local_48,this,(uint32_t)*(size_type *)(p_Var5 + 1));
        local_50 = (ulong)(uint)*(size_type *)(p_Var5 + 1);
        this_00 = ::std::__detail::
                  _Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::BufferHandle>,_std::allocator<std::pair<const_unsigned_long,_duckdb::BufferHandle>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::BufferHandle>,_std::allocator<std::pair<const_unsigned_long,_duckdb::BufferHandle>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)state,&local_50);
        BufferHandle::operator=(this_00,&local_48);
        BufferHandle::~BufferHandle(&local_48);
      }
    }
  }
  return;
}

Assistant:

void ColumnDataAllocator::InitializeChunkState(ChunkManagementState &state, ChunkMetaData &chunk) {
	if (type != ColumnDataAllocatorType::BUFFER_MANAGER_ALLOCATOR && type != ColumnDataAllocatorType::HYBRID) {
		// nothing to pin
		return;
	}
	// release any handles that are no longer required
	bool found_handle;
	do {
		found_handle = false;
		for (auto it = state.handles.begin(); it != state.handles.end(); it++) {
			if (chunk.block_ids.find(NumericCast<uint32_t>(it->first)) != chunk.block_ids.end()) {
				// still required: do not release
				continue;
			}
			state.handles.erase(it);
			found_handle = true;
			break;
		}
	} while (found_handle);

	// grab any handles that are now required
	for (auto &block_id : chunk.block_ids) {
		if (state.handles.find(block_id) != state.handles.end()) {
			// already pinned: don't need to do anything
			continue;
		}
		state.handles[block_id] = Pin(block_id);
	}
}